

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O3

void anon_unknown.dwarf_665b50::ImplPosix::OnReadCB(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  if (nread == 0) {
    return;
  }
  if (-1 < nread) {
    if (nread == 1) {
      cmUVJobServerClient::Impl::ReceivedToken((Impl *)stream->data);
      return;
    }
    __assert_fail("nread == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmUVJobServerClient.cxx"
                  ,0x197,"void (anonymous namespace)::ImplPosix::OnRead(ssize_t, const uv_buf_t *)")
    ;
  }
  Disconnect((ImplPosix *)stream->data,(int)nread);
  return;
}

Assistant:

void ImplPosix::OnRead(ssize_t nread, const uv_buf_t* /*buf*/)
{
  if (nread == 0) {
    return;
  }

  if (nread < 0) {
    auto status = static_cast<int>(nread);
    this->Disconnect(status);
    return;
  }

  assert(nread == 1);
  this->ReceivedToken();
}